

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void Parse(lemon *gp)

{
  char *pcVar1;
  char cVar2;
  ushort *puVar3;
  int iVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  FILE *__stream;
  ulong uVar8;
  char *__ptr;
  size_t sVar9;
  long lVar10;
  long lVar11;
  ushort **ppuVar12;
  rule *prVar13;
  undefined8 *puVar14;
  symbol *psVar15;
  undefined8 *puVar16;
  long *__ptr_00;
  void *pvVar17;
  char cVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  char *pcVar22;
  uint uVar23;
  char *pcVar24;
  char **ppcVar25;
  uint uVar26;
  int iVar27;
  size_t sVar28;
  char *pcVar29;
  ulong uVar30;
  char *pcVar31;
  char *pcVar32;
  long lVar33;
  bool bVar34;
  size_t local_3fb8;
  uint local_3fa8;
  int local_3fa4;
  char *endptr;
  char *local_3f38;
  uint local_3f30;
  int local_3f2c;
  char *local_3f28;
  lemon *local_3f20;
  undefined4 local_3f18;
  symbol *local_3f10;
  symbol *local_3f08;
  char *local_3f00;
  uint local_3ef8;
  long alStack_3ef0 [999];
  undefined8 auStack_1fb8 [1001];
  rule *local_70;
  char *local_68;
  char **local_60;
  int local_58;
  int *local_50;
  undefined4 local_48;
  int iStack_44;
  rule *prStack_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  memset(&local_3f30,0,0x3f00);
  pcVar32 = gp->filename;
  local_3f18 = 0;
  local_3f38 = pcVar32;
  local_3f20 = gp;
  __stream = fopen(pcVar32,"rb");
  if (__stream == (FILE *)0x0) {
    ErrorMsg(pcVar32,0,"Can\'t open this file for reading.");
    gp->errorcnt = gp->errorcnt + 1;
  }
  else {
    fseek(__stream,0,2);
    uVar8 = ftell(__stream);
    rewind(__stream);
    uVar26 = (int)uVar8 + 1;
    __ptr = (char *)malloc((long)(int)uVar26);
    if (__ptr == (char *)0x0) {
      ErrorMsg(pcVar32,0,"Can\'t allocate %d of memory to hold this file.",(ulong)uVar26);
    }
    else {
      sVar28 = (size_t)(int)uVar8;
      sVar9 = fread(__ptr,1,sVar28,__stream);
      if (sVar9 == sVar28) {
        fclose(__stream);
        __ptr[sVar28] = '\0';
        ppcVar25 = azDefine;
        lVar10 = (long)nDefine;
        lVar33 = 0;
        uVar8 = 0;
        if (0 < nDefine) {
          uVar8 = (ulong)(uint)nDefine;
        }
        pcVar32 = __ptr + 6;
        uVar20 = 6;
        uVar23 = 0;
        local_3fa4 = 0;
        local_3fa8 = 1;
        uVar26 = 1;
        pcVar31 = __ptr;
        pcVar29 = __ptr;
        do {
          pcVar29 = pcVar29 + 1;
          cVar18 = __ptr[lVar33];
          if (cVar18 == '\n') {
            uVar26 = uVar26 + 1;
          }
          else if (cVar18 == '%') {
            pcVar22 = __ptr + lVar33;
            if ((lVar33 == 0) || (pcVar22[-1] == '\n')) {
              iVar7 = strncmp(pcVar22,"%endif",6);
              if ((iVar7 == 0) &&
                 (ppuVar12 = __ctype_b_loc(),
                 (*(byte *)((long)*ppuVar12 + (long)pcVar22[6] * 2 + 1) & 0x20) != 0)) {
                pcVar22 = pcVar31;
                if (uVar23 == 0) {
LAB_00105be4:
                  uVar23 = 0;
                }
                else {
                  uVar23 = uVar23 - 1;
                  if (uVar23 == 0) {
                    for (lVar11 = (long)local_3fa4; lVar11 < lVar33; lVar11 = lVar11 + 1) {
                      if (__ptr[lVar11] != '\n') {
                        __ptr[lVar11] = ' ';
                      }
                    }
                    goto LAB_00105be4;
                  }
                }
                for (; (*pcVar22 != '\0' && (*pcVar22 != '\n')); pcVar22 = pcVar22 + 1) {
                  *pcVar22 = ' ';
                }
              }
              else {
                iVar7 = strncmp(pcVar22,"%ifdef",6);
                if (((iVar7 == 0) &&
                    (ppuVar12 = __ctype_b_loc(),
                    (*(byte *)((long)*ppuVar12 + (long)pcVar22[6] * 2 + 1) & 0x20) != 0)) ||
                   ((iVar7 = strncmp(pcVar22,"%ifndef",7), iVar7 == 0 &&
                    (ppuVar12 = __ctype_b_loc(),
                    (*(byte *)((long)*ppuVar12 + (long)pcVar22[7] * 2 + 1) & 0x20) != 0)))) {
                  if (uVar23 == 0) {
                    ppuVar12 = __ctype_b_loc();
                    uVar19 = uVar20;
                    pcVar24 = pcVar32;
                    do {
                      pcVar1 = pcVar24 + 1;
                      pcVar24 = pcVar24 + 1;
                      uVar19 = uVar19 + 1;
                    } while ((*(byte *)((long)*ppuVar12 + (long)*pcVar1 * 2 + 1) & 0x20) != 0);
                    uVar30 = 0;
                    while (((long)__ptr[uVar30 + (uVar19 & 0xffffffff)] != 0 &&
                           ((*(byte *)((long)*ppuVar12 +
                                      (long)__ptr[uVar30 + (uVar19 & 0xffffffff)] * 2 + 1) & 0x20)
                            == 0))) {
                      uVar30 = uVar30 + 1;
                    }
                    for (uVar19 = 0; uVar8 != uVar19; uVar19 = uVar19 + 1) {
                      pcVar1 = ppcVar25[uVar19];
                      iVar7 = strncmp(pcVar1,pcVar24,uVar30 & 0xffffffff);
                      if ((iVar7 == 0) && (sVar9 = strlen(pcVar1), (int)sVar9 == (int)uVar30)) {
                        bVar34 = false;
                        goto LAB_00105c98;
                      }
                    }
                    bVar34 = true;
                    uVar19 = uVar8;
LAB_00105c98:
                    bVar5 = (long)uVar19 < lVar10;
                    if (pcVar22[3] != 'n') {
                      bVar5 = bVar34;
                    }
                    if (bVar5) {
                      local_3fa4 = (int)lVar33;
                      local_3fa8 = uVar26;
                    }
                    uVar23 = (uint)bVar5;
                  }
                  else {
                    uVar23 = uVar23 + 1;
                  }
                  cVar18 = '%';
                  pcVar22 = pcVar29;
                  while ((cVar18 != '\0' && (cVar18 != '\n'))) {
                    pcVar22[-1] = ' ';
                    cVar18 = *pcVar22;
                    pcVar22 = pcVar22 + 1;
                  }
                }
              }
            }
          }
          else if (cVar18 == '\0') goto LAB_00105d7b;
          lVar33 = lVar33 + 1;
          pcVar31 = pcVar31 + 1;
          pcVar32 = pcVar32 + 1;
          uVar20 = uVar20 + 1;
        } while( true );
      }
      ErrorMsg(pcVar32,0,"Can\'t read in all %d bytes of this file.",uVar8 & 0xffffffff);
      free(__ptr);
    }
    gp->errorcnt = gp->errorcnt + 1;
  }
  return;
LAB_00105d7b:
  if (uVar23 != 0) {
    fprintf(_stderr,"unterminated %%ifdef starting on line %d\n",(ulong)local_3fa8);
    exit(1);
  }
  pcVar32 = __ptr;
  uVar26 = 1;
LAB_00105d8a:
  do {
    cVar18 = *pcVar32;
    pcVar29 = pcVar32;
    while( true ) {
      if (cVar18 == '\n') {
        uVar26 = uVar26 + 1;
      }
      else if (cVar18 == '\0') {
        free(__ptr);
        gp->rule = prStack_40;
        gp->errorcnt = local_3f2c;
        return;
      }
      ppuVar12 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar12 + (long)cVar18 * 2 + 1) & 0x20) != 0) {
        pcVar32 = pcVar29 + 1;
        goto LAB_00105d8a;
      }
      pcVar31 = pcVar29;
      uVar23 = uVar26;
      if (cVar18 != '/') {
        if (cVar18 == '\"') {
          do {
            pcVar32 = pcVar31 + 1;
            do {
              pcVar31 = pcVar32;
              cVar18 = *pcVar31;
              if (cVar18 == '\0') {
                local_3f30 = uVar26;
                local_3f28 = pcVar29;
                ErrorMsg(local_3f38,0,
                         "String starting on this line is not terminated before the end of the file."
                        );
                local_3f2c = local_3f2c + 1;
                pcVar32 = pcVar31;
                goto LAB_0010605f;
              }
              pcVar32 = pcVar31 + 1;
              local_3f30 = uVar26;
              local_3f28 = pcVar29;
              if (cVar18 == '\"') goto LAB_0010605f;
            } while (cVar18 != '\n');
            uVar23 = uVar23 + 1;
          } while( true );
        }
        if (cVar18 != '{') goto LAB_00105f46;
        iVar7 = 1;
        goto LAB_00105e47;
      }
      if (pcVar29[1] != '/') break;
      for (pcVar29 = pcVar29 + 2; (cVar18 = *pcVar29, cVar18 != '\0' && (cVar18 != '\n'));
          pcVar29 = pcVar29 + 1) {
      }
    }
    if (pcVar29[1] != '*') {
LAB_00105f46:
      puVar3 = *ppuVar12;
      if ((puVar3[cVar18] & 8) == 0) {
        if ((cVar18 == '/') || (cVar18 == '|')) {
          if ((*(byte *)((long)puVar3 + (long)pcVar29[1] * 2 + 1) & 4) == 0) goto LAB_00105fd2;
          pcVar31 = pcVar29 + 2;
          while( true ) {
            cVar18 = *pcVar31;
            pcVar32 = pcVar31;
            local_3f30 = uVar26;
            local_3f28 = pcVar29;
            if (((long)cVar18 == 0) || ((cVar18 != '_' && ((puVar3[cVar18] & 8) == 0)))) break;
            pcVar31 = pcVar31 + 1;
          }
        }
        else if (((cVar18 == ':') && (pcVar29[1] == ':')) && (pcVar29[2] == '=')) {
          pcVar31 = pcVar29 + 3;
          pcVar32 = pcVar31;
          local_3f30 = uVar26;
          local_3f28 = pcVar29;
        }
        else {
LAB_00105fd2:
          pcVar31 = pcVar29 + 1;
          pcVar32 = pcVar31;
          local_3f30 = uVar26;
          local_3f28 = pcVar29;
        }
      }
      else {
        while( true ) {
          cVar18 = *pcVar31;
          pcVar32 = pcVar31;
          local_3f30 = uVar26;
          local_3f28 = pcVar29;
          if (((long)cVar18 == 0) || ((cVar18 != '_' && ((puVar3[cVar18] & 8) == 0)))) break;
          pcVar31 = pcVar31 + 1;
        }
      }
      goto LAB_0010605f;
    }
    for (pcVar29 = pcVar29 + 2; cVar18 = *pcVar29, cVar18 != '\0'; pcVar29 = pcVar29 + 1) {
      if (cVar18 == '\n') {
        uVar26 = uVar26 + 1;
      }
      else if ((cVar18 == '/') && (pcVar29[-1] == '*')) break;
    }
    pcVar32 = pcVar29 + (cVar18 != '\0');
  } while( true );
LAB_00105e47:
  pcVar32 = pcVar31;
  pcVar31 = pcVar32 + 1;
  cVar18 = pcVar32[1];
  if (cVar18 != '\0') {
    if ((iVar7 < 2) && (cVar18 == '}')) {
      pcVar32 = pcVar32 + 2;
      local_3f30 = uVar26;
      local_3f28 = pcVar29;
      goto LAB_0010605f;
    }
    if (cVar18 == '\n') {
LAB_00105f2f:
      uVar23 = uVar23 + 1;
    }
    else if ((cVar18 == '\"') || (cVar18 == '\'')) {
      cVar6 = '\0';
      for (pcVar31 = pcVar32 + 2;
          (cVar2 = *pcVar31, cVar2 != '\0' && ((cVar6 == '\\' || (cVar2 != cVar18))));
          pcVar31 = pcVar31 + 1) {
        uVar23 = uVar23 + (cVar2 == '\n');
        bVar34 = cVar6 == '\\';
        cVar6 = cVar2;
        if (bVar34) {
          cVar6 = '\0';
        }
      }
    }
    else if (cVar18 == '/') {
      if (pcVar32[2] == '/') {
        for (pcVar31 = pcVar32 + 3; *pcVar31 != '\0'; pcVar31 = pcVar31 + 1) {
          if (*pcVar31 == '\n') goto LAB_00105f2f;
        }
      }
      else if (pcVar32[2] == '*') {
        cVar18 = '\0';
        for (pcVar31 = pcVar32 + 3;
            (cVar6 = *pcVar31, cVar6 != '\0' && (cVar18 != '*' || cVar6 != '/'));
            pcVar31 = pcVar31 + 1) {
          uVar23 = uVar23 + (cVar6 == '\n');
          cVar18 = cVar6;
        }
      }
    }
    else if (cVar18 == '{') {
      iVar7 = iVar7 + 1;
    }
    else if (cVar18 == '}') {
      iVar7 = iVar7 + -1;
    }
    goto LAB_00105e47;
  }
  local_3f30 = uVar26;
  local_3f28 = pcVar29;
  ErrorMsg(local_3f38,uVar26,
           "C code starting on this line is not terminated before the end of the file.");
  local_3f2c = local_3f2c + 1;
  pcVar32 = pcVar31;
LAB_0010605f:
  cVar18 = *pcVar31;
  *pcVar31 = '\0';
  pcVar29 = Strsafe(local_3f28);
  prVar13 = local_70;
  uVar26 = local_3ef8;
  psVar15 = local_3f10;
  switch(local_3f18) {
  case 0:
    local_70 = (rule *)0x0;
    iStack_44 = 0;
    prStack_40 = (rule *)0x0;
    uStack_38 = 0;
    uStack_34 = 0;
    local_3f20->nrule = 0;
  case 1:
    cVar6 = *pcVar29;
    if ((long)cVar6 == 0x25) {
LAB_001062b4:
      local_3f18 = 2;
    }
    else if ((*(byte *)((long)*ppuVar12 + (long)cVar6 * 2 + 1) & 2) == 0) {
      if (cVar6 == '[') {
        local_3f18 = 0xc;
      }
      else {
        if (cVar6 == '{') {
          if (local_70 == (rule *)0x0) {
            pcVar29 = 
            "There is no prior rule opon which to attach the code fragment which begins on this line."
            ;
          }
          else {
            if (local_70->code == (char *)0x0) {
              local_70->line = local_3f30;
              local_70->code = pcVar29 + 1;
              goto switchD_00106095_default;
            }
            pcVar29 = 
            "Code fragment beginning on this line is not the first to follow the previous rule.";
          }
LAB_0010707c:
          ErrorMsg(local_3f38,local_3f30,pcVar29);
        }
        else {
          pcVar22 = "Token \"%s\" should be either \"%%\" or a nonterminal name.";
LAB_00106d60:
          ErrorMsg(local_3f38,local_3f30,pcVar22,pcVar29);
        }
        local_3f2c = local_3f2c + 1;
        psVar15 = local_3f10;
      }
    }
    else {
      local_3f08 = Symbol_new(pcVar29);
      local_3ef8 = 0;
      local_3f00 = (char *)0x0;
      local_3f18 = 5;
      psVar15 = local_3f10;
    }
    goto switchD_00106095_default;
  case 2:
    if ((*(byte *)((long)*ppuVar12 + (long)*pcVar29 * 2 + 1) & 4) != 0) {
      local_60 = (char **)0x0;
      local_50 = (int *)0x0;
      local_58 = 1;
      local_3f18 = 3;
      local_68 = pcVar29;
      iVar7 = strcmp(pcVar29,"name");
      if (iVar7 == 0) {
        local_60 = &local_3f20->name;
        goto LAB_00106cc9;
      }
      iVar7 = strcmp(pcVar29,"include");
      if (iVar7 == 0) {
        local_60 = &local_3f20->include;
        psVar15 = local_3f10;
        goto switchD_00106095_default;
      }
      iVar7 = strcmp(pcVar29,"code");
      if (iVar7 == 0) {
        lVar10 = 0x98;
      }
      else {
        iVar7 = strcmp(pcVar29,"token_destructor");
        if (iVar7 == 0) {
          lVar10 = 0xa0;
        }
        else {
          iVar7 = strcmp(pcVar29,"default_destructor");
          if (iVar7 == 0) {
            lVar10 = 0xa8;
          }
          else {
            iVar7 = strcmp(pcVar29,"token_prefix");
            if (iVar7 == 0) {
              local_60 = &local_3f20->tokenprefix;
LAB_00106cc9:
              local_58 = 0;
              psVar15 = local_3f10;
              goto switchD_00106095_default;
            }
            iVar7 = strcmp(pcVar29,"syntax_error");
            if (iVar7 == 0) {
              local_60 = &local_3f20->error;
              psVar15 = local_3f10;
              goto switchD_00106095_default;
            }
            iVar7 = strcmp(pcVar29,"parse_accept");
            if (iVar7 == 0) {
              lVar10 = 0x90;
            }
            else {
              iVar7 = strcmp(pcVar29,"parse_failure");
              if (iVar7 != 0) {
                iVar7 = strcmp(pcVar29,"stack_overflow");
                if (iVar7 == 0) {
                  local_60 = &local_3f20->overflow;
                  psVar15 = local_3f10;
                  goto switchD_00106095_default;
                }
                iVar7 = strcmp(pcVar29,"extra_argument");
                if (iVar7 == 0) {
                  local_60 = &local_3f20->arg;
                }
                else {
                  iVar7 = strcmp(pcVar29,"token_type");
                  if (iVar7 == 0) {
                    local_60 = &local_3f20->tokentype;
                  }
                  else {
                    iVar7 = strcmp(pcVar29,"default_type");
                    if (iVar7 == 0) {
                      local_60 = &local_3f20->vartype;
                    }
                    else {
                      iVar7 = strcmp(pcVar29,"stack_size");
                      if (iVar7 == 0) {
                        local_60 = &local_3f20->stacksize;
                      }
                      else {
                        iVar7 = strcmp(pcVar29,"start_symbol");
                        if (iVar7 != 0) {
                          iVar7 = strcmp(pcVar29,"left");
                          if (iVar7 == 0) {
                            iStack_44 = iStack_44 + 1;
                            local_48 = 0;
                          }
                          else {
                            iVar7 = strcmp(pcVar29,"right");
                            if (iVar7 == 0) {
                              iStack_44 = iStack_44 + 1;
                              local_48 = 1;
                            }
                            else {
                              iVar7 = strcmp(pcVar29,"nonassoc");
                              if (iVar7 != 0) {
                                iVar7 = strcmp(pcVar29,"destructor");
                                if (iVar7 == 0) {
                                  local_3f18 = 0x10;
                                  psVar15 = local_3f10;
                                  goto switchD_00106095_default;
                                }
                                iVar7 = strcmp(pcVar29,"type");
                                if (iVar7 == 0) {
                                  local_3f18 = 0x11;
                                  psVar15 = local_3f10;
                                  goto switchD_00106095_default;
                                }
                                iVar7 = strcmp(pcVar29,"fallback");
                                if (iVar7 == 0) {
                                  local_3f10 = (symbol *)0x0;
                                  local_3f18 = 0x12;
                                  psVar15 = local_3f10;
                                  goto switchD_00106095_default;
                                }
                                iVar7 = strcmp(pcVar29,"wildcard");
                                if (iVar7 == 0) {
                                  local_3f18 = 0x14;
                                  psVar15 = local_3f10;
                                  goto switchD_00106095_default;
                                }
                                iVar7 = strcmp(pcVar29,"expect");
                                if (iVar7 == 0) {
                                  if (local_3f20->nexpected < 0) {
                                    local_3f18 = 0x13;
                                    psVar15 = local_3f10;
                                    goto switchD_00106095_default;
                                  }
                                  pcVar29 = "Multiple %expect declarations.";
                                  goto LAB_00106347;
                                }
                                pcVar22 = "Unknown declaration keyword: \"%%%s\".";
                                goto LAB_001061e4;
                              }
                              iStack_44 = iStack_44 + 1;
                              local_48 = 2;
                            }
                          }
                          local_3f18 = 4;
                          psVar15 = local_3f10;
                          goto switchD_00106095_default;
                        }
                        local_60 = &local_3f20->start;
                      }
                    }
                  }
                }
                goto LAB_00106cc9;
              }
              lVar10 = 0x88;
            }
          }
        }
      }
      local_60 = (char **)((long)&local_3f20->sorted + lVar10);
      psVar15 = local_3f10;
      goto switchD_00106095_default;
    }
    pcVar22 = "Illegal declaration keyword: \"%s\".";
LAB_001061e4:
    ErrorMsg(local_3f38,local_3f30,pcVar22,pcVar29);
    goto LAB_0010634e;
  case 3:
    cVar6 = *pcVar29;
    if (((cVar6 == '\"') || (cVar6 == '{')) || (((*ppuVar12)[cVar6] & 8) != 0)) {
      if ((cVar6 == '{') || (cVar6 == '\"')) {
        pcVar29 = pcVar29 + 1;
      }
      sVar9 = strlen(pcVar29);
      ppcVar25 = local_60;
      pcVar22 = *local_60;
      pcVar24 = pcVar22;
      if (pcVar22 == (char *)0x0) {
        pcVar24 = "";
      }
      sVar28 = strlen(pcVar24);
      iVar7 = (int)sVar28;
      iVar4 = (int)sVar9;
      iVar21 = iVar7 + iVar4 + 0x14;
      if ((local_3f20->nolinenosflag == 0) && (local_58 != 0)) {
        if ((local_50 == (int *)0x0) || (*local_50 != 0)) {
          iVar27 = 0;
          pcVar22 = local_3f38;
          do {
            if (*pcVar22 == '\\') {
              iVar27 = iVar27 + 1;
            }
            else if (*pcVar22 == '\0') goto LAB_00106ab6;
            pcVar22 = pcVar22 + 1;
          } while( true );
        }
        bVar34 = false;
        local_3fb8 = 0;
      }
      else {
        local_3fb8 = 0;
        bVar34 = false;
      }
      goto LAB_00106ded;
    }
    ErrorMsg(local_3f38,local_3f30,"Illegal argument to %%%s: %s",local_68);
    goto LAB_0010634e;
  case 4:
    if ((long)*pcVar29 == 0x2e) break;
    if ((*(byte *)((long)*ppuVar12 + (long)*pcVar29 * 2 + 1) & 1) == 0) {
      pcVar22 = "Can\'t assign a precedence to \"%s\".";
    }
    else {
      psVar15 = Symbol_new(pcVar29);
      if (psVar15->prec < 0) {
        psVar15->prec = iStack_44;
        psVar15->assoc = local_48;
        psVar15 = local_3f10;
        goto switchD_00106095_default;
      }
      pcVar22 = "Symbol \"%s\" has already be given a precedence.";
    }
    goto LAB_00106d60;
  case 5:
    if (*pcVar29 == '(') {
      local_3f18 = 7;
      goto switchD_00106095_default;
    }
    if (((*pcVar29 == ':') && (pcVar29[1] == ':')) && (pcVar29[2] == '=')) goto LAB_001060f1;
    pcVar29 = local_3f08->name;
    pcVar22 = "Expected to see a \":\" following the LHS symbol \"%s\".";
    goto LAB_0010651e;
  case 6:
    cVar6 = *pcVar29;
    if ((long)cVar6 == 0x2e) {
      lVar10 = (long)(int)local_3ef8;
      prVar13 = (rule *)calloc(lVar10 * 0x10 + 0x60,1);
      if (prVar13 == (rule *)0x0) {
        ErrorMsg(local_3f38,local_3f30,"Can\'t allocate enough memory for this rule.");
        local_3f2c = local_3f2c + 1;
        local_70 = prVar13;
      }
      else {
        prVar13->ruleline = local_3f30;
        prVar13->rhs = &prVar13[1].lhs;
        prVar13->rhsalias = (char **)(&prVar13[1].lhs + lVar10);
        uVar8 = 0;
        if (0 < (int)uVar26) {
          uVar8 = (ulong)uVar26;
        }
        for (uVar20 = 0; uVar8 != uVar20; uVar20 = uVar20 + 1) {
          prVar13->rhs[uVar20] = (symbol *)alStack_3ef0[uVar20];
          prVar13->rhsalias[uVar20] = (char *)auStack_1fb8[uVar20 + 1];
        }
        prVar13->lhs = local_3f08;
        prVar13->lhsalias = local_3f00;
        prVar13->nrhs = uVar26;
        prVar13->code = (char *)0x0;
        prVar13->precsym = (symbol *)0x0;
        iVar7 = local_3f20->nrule;
        local_3f20->nrule = iVar7 + 1;
        prVar13->index = iVar7;
        prVar13->nextlhs = local_3f08->rule;
        local_3f08->rule = prVar13;
        prVar13->next = (rule *)0x0;
        puVar14 = (undefined8 *)(CONCAT44(uStack_34,uStack_38) + 0x58);
        if (prStack_40 == (rule *)0x0) {
          puVar14 = (undefined8 *)&uStack_38;
        }
        *puVar14 = prVar13;
        (&prStack_40)[prStack_40 != (rule *)0x0] = prVar13;
        local_70 = prVar13;
      }
      goto LAB_00106eb2;
    }
    if ((*(byte *)((long)*ppuVar12 + (long)cVar6 * 2 + 1) & 4) != 0) {
      lVar10 = (long)(int)local_3ef8;
      if (lVar10 < 1000) {
        psVar15 = Symbol_new(pcVar29);
        alStack_3ef0[lVar10] = (long)psVar15;
        auStack_1fb8[lVar10 + 1] = 0;
        local_3ef8 = uVar26 + 1;
        psVar15 = local_3f10;
      }
      else {
        ErrorMsg(local_3f38,local_3f30,"Too many symbols on RHS of rule beginning at \"%s\".",
                 pcVar29);
        local_3f2c = local_3f2c + 1;
        local_3f18 = 0xe;
        psVar15 = local_3f10;
      }
      goto switchD_00106095_default;
    }
    if (cVar6 == '(') {
      if (0 < (int)local_3ef8) {
        local_3f18 = 10;
        goto switchD_00106095_default;
      }
LAB_00106f32:
      ErrorMsg(local_3f38,local_3f30,"Illegal character on RHS of rule: \"%s\".",pcVar29);
      local_3f2c = local_3f2c + 1;
      local_3f18 = 0xe;
      psVar15 = local_3f10;
      goto switchD_00106095_default;
    }
    if (((cVar6 != '|') && (cVar6 != '/')) || ((int)local_3ef8 < 1)) goto LAB_00106f32;
    uVar26 = local_3ef8 - 1;
    puVar14 = (undefined8 *)alStack_3ef0[uVar26];
    if (*(int *)((long)puVar14 + 0xc) == 2) {
      __ptr_00 = (long *)puVar14[0xb];
      iVar7 = *(int *)((long)puVar14 + 0x54) + 1;
      puVar16 = puVar14;
    }
    else {
      puVar16 = (undefined8 *)calloc(1,0x60);
      *(undefined4 *)((long)puVar16 + 0xc) = 2;
      *(undefined4 *)((long)puVar16 + 0x54) = 1;
      __ptr_00 = (long *)calloc(1,8);
      puVar16[0xb] = __ptr_00;
      *__ptr_00 = (long)puVar14;
      *puVar16 = *puVar14;
      alStack_3ef0[uVar26] = (long)puVar16;
      iVar7 = 2;
    }
    *(int *)((long)puVar16 + 0x54) = iVar7;
    pvVar17 = realloc(__ptr_00,(long)iVar7 << 3);
    puVar16[0xb] = pvVar17;
    psVar15 = Symbol_new(pcVar29 + 1);
    *(symbol **)(puVar16[0xb] + -8 + (long)*(int *)((long)puVar16 + 0x54) * 8) = psVar15;
    if (((*(byte *)((long)*ppuVar12 + (long)pcVar29[1] * 2 + 1) & 2) == 0) &&
       (psVar15 = local_3f10,
       (*(byte *)((long)*ppuVar12 + (long)*(char *)**(undefined8 **)puVar16[0xb] * 2 + 1) & 2) == 0)
       ) goto switchD_00106095_default;
    pcVar29 = "Cannot form a compound containing a non-terminal";
    goto LAB_0010707c;
  case 7:
    if ((*(byte *)((long)*ppuVar12 + (long)*pcVar29 * 2 + 1) & 4) != 0) {
      local_3f18 = 8;
      local_3f00 = pcVar29;
      goto switchD_00106095_default;
    }
    pcVar22 = "\"%s\" is not a valid alias for the LHS \"%s\"\n";
    goto LAB_001064e1;
  case 8:
    if (*pcVar29 == ')') {
      local_3f18 = 9;
      goto switchD_00106095_default;
    }
    goto LAB_00106500;
  case 9:
    if (((*pcVar29 == ':') && (pcVar29[1] == ':')) && (pcVar29[2] == '=')) {
LAB_001060f1:
      local_3f18 = 6;
      goto switchD_00106095_default;
    }
    pcVar29 = local_3f08->name;
    pcVar22 = "Missing \"->\" following: \"%s(%s)\".";
    goto LAB_001064e1;
  case 10:
    if ((*(byte *)((long)*ppuVar12 + (long)*pcVar29 * 2 + 1) & 4) != 0) {
      auStack_1fb8[(int)local_3ef8] = pcVar29;
      local_3f18 = 0xb;
      goto switchD_00106095_default;
    }
    pcVar22 = "\"%s\" is not a valid alias for the RHS symbol \"%s\"\n";
LAB_001064e1:
    ErrorMsg(local_3f38,local_3f30,pcVar22,pcVar29);
LAB_00106525:
    local_3f2c = local_3f2c + 1;
    local_3f18 = 0xe;
    psVar15 = local_3f10;
    goto switchD_00106095_default;
  case 0xb:
    if (*pcVar29 == ')') goto LAB_001060f1;
LAB_00106500:
    pcVar22 = "Missing \")\" following LHS alias name \"%s\".";
    pcVar29 = local_3f00;
LAB_0010651e:
    ErrorMsg(local_3f38,local_3f30,pcVar22,pcVar29);
    goto LAB_00106525;
  case 0xc:
    if ((*(byte *)((long)*ppuVar12 + (long)*pcVar29 * 2 + 1) & 1) == 0) {
      ErrorMsg(local_3f38,local_3f30,"The precedence symbol must be a terminal.");
      local_3f2c = local_3f2c + 1;
    }
    else {
      if (local_70 == (rule *)0x0) {
        ErrorMsg(local_3f38,local_3f30,"There is no prior rule to assign precedence \"[%s]\".",
                 pcVar29);
      }
      else {
        if (local_70->precsym == (symbol *)0x0) {
          psVar15 = Symbol_new(pcVar29);
          prVar13->precsym = psVar15;
          goto LAB_00106db0;
        }
        ErrorMsg(local_3f38,local_3f30,
                 "Precedence mark on this line is not the first to follow the previous rule.");
      }
      local_3f2c = local_3f2c + 1;
    }
LAB_00106db0:
    local_3f18 = 0xd;
    psVar15 = local_3f10;
    goto switchD_00106095_default;
  case 0xd:
    if (*pcVar29 != ']') {
      pcVar22 = "Missing \"]\" on precedence mark.";
LAB_001065c9:
      ErrorMsg(local_3f38,local_3f30,pcVar22);
      local_3f2c = local_3f2c + 1;
    }
    break;
  case 0xe:
  case 0xf:
    cVar6 = *pcVar29;
    if (cVar6 == '.') {
      local_3f18 = 1;
      cVar6 = *pcVar29;
    }
    if (cVar6 != '%') goto switchD_00106095_default;
    goto LAB_001062b4;
  case 0x10:
    if ((*(byte *)((long)*ppuVar12 + (long)*pcVar29 * 2 + 1) & 4) != 0) {
      psVar15 = Symbol_new(pcVar29);
      local_60 = &psVar15->destructor;
      local_50 = &psVar15->destLineno;
      local_58 = 1;
      local_3f18 = 3;
      psVar15 = local_3f10;
      goto switchD_00106095_default;
    }
    pcVar29 = "Symbol name missing after %%destructor keyword";
    goto LAB_00106347;
  case 0x11:
    if ((*(byte *)((long)*ppuVar12 + (long)*pcVar29 * 2 + 1) & 4) != 0) {
      psVar15 = Symbol_find(pcVar29);
      if (psVar15 == (symbol *)0x0) {
        psVar15 = Symbol_new(pcVar29);
      }
      else if (psVar15->datatype != (char *)0x0) {
        ErrorMsg(local_3f38,local_3f30,"Symbol %%type \"%s\" already defined",pcVar29);
        local_3f2c = local_3f2c + 1;
        local_3f18 = 0xf;
        psVar15 = local_3f10;
        goto switchD_00106095_default;
      }
      local_60 = &psVar15->datatype;
      local_58 = 0;
      local_3f18 = 3;
      psVar15 = local_3f10;
      goto switchD_00106095_default;
    }
    pcVar29 = "Symbol name missing after %%type keyword";
LAB_00106347:
    ErrorMsg(local_3f38,local_3f30,pcVar29);
LAB_0010634e:
    local_3f2c = local_3f2c + 1;
    local_3f18 = 0xf;
    psVar15 = local_3f10;
    goto switchD_00106095_default;
  case 0x12:
    if ((long)*pcVar29 != 0x2e) {
      if ((*(byte *)((long)*ppuVar12 + (long)*pcVar29 * 2 + 1) & 1) == 0) {
        pcVar22 = "%%fallback argument \"%s\" should be a token";
      }
      else {
        psVar15 = Symbol_new(pcVar29);
        if (local_3f10 == (symbol *)0x0) goto switchD_00106095_default;
        if (psVar15->fallback == (symbol *)0x0) {
          psVar15->fallback = local_3f10;
          local_3f20->has_fallback = 1;
          psVar15 = local_3f10;
          goto switchD_00106095_default;
        }
        pcVar22 = "More than one fallback assigned to token %s";
      }
      goto LAB_00106d60;
    }
    break;
  case 0x13:
    lVar10 = strtol(pcVar29,&endptr,10);
    local_3f20->nexpected = (int)lVar10;
    pcVar22 = "Integer expected after %%expect keyword";
    if (((endptr == pcVar29) ||
        (pcVar22 = "Integer expected after %%expect keyword", *endptr != '\0')) ||
       (pcVar22 = "Integer can\'t be negative after %%expect keyword", (int)lVar10 < 0))
    goto LAB_001065c9;
    break;
  case 0x14:
    if ((long)*pcVar29 != 0x2e) {
      if ((*(byte *)((long)*ppuVar12 + (long)*pcVar29 * 2 + 1) & 1) == 0) {
        pcVar22 = "%%wildcard argument \"%s\" should be a token";
      }
      else {
        psVar15 = Symbol_new(pcVar29);
        if (local_3f20->wildcard == (symbol *)0x0) {
          local_3f20->wildcard = psVar15;
          psVar15 = local_3f10;
          goto switchD_00106095_default;
        }
        pcVar22 = "Extra wildcard to token: %s";
      }
      goto LAB_00106d60;
    }
    break;
  default:
    goto switchD_00106095_default;
  }
  local_3f18 = 1;
  psVar15 = local_3f10;
switchD_00106095_default:
  local_3f10 = psVar15;
  *pcVar31 = cVar18;
  uVar26 = uVar23;
  goto LAB_00105d8a;
LAB_00106ab6:
  sprintf((char *)&endptr,"#line %d ",(ulong)local_3f30);
  sVar9 = strlen((char *)&endptr);
  sVar28 = strlen(local_3f38);
  iVar21 = iVar27 + iVar21 + (int)sVar9 + (int)sVar28;
  local_3fb8 = (size_t)(int)sVar9;
  pcVar22 = *local_60;
  bVar34 = true;
  ppcVar25 = local_60;
LAB_00106ded:
  pcVar22 = (char *)realloc(pcVar22,(long)iVar21);
  *ppcVar25 = pcVar22;
  pcVar22 = *local_60 + iVar7;
  if (bVar34) {
    if ((iVar7 != 0) && (pcVar22[-1] != '\n')) {
      *pcVar22 = '\n';
      pcVar22 = pcVar22 + 1;
    }
    memcpy(pcVar22,&endptr,local_3fb8);
    pcVar24 = pcVar22 + local_3fb8;
    pcVar22[local_3fb8] = '\"';
    pcVar22 = local_3f38;
    do {
      cVar6 = *pcVar22;
      if (cVar6 == '\\') {
        pcVar24[1] = '\\';
        pcVar24 = pcVar24 + 2;
        cVar6 = *pcVar22;
      }
      else {
        if (cVar6 == '\0') goto LAB_00106e74;
        pcVar24 = pcVar24 + 1;
      }
      *pcVar24 = cVar6;
      pcVar22 = pcVar22 + 1;
    } while( true );
  }
  goto LAB_00106e81;
LAB_00106e74:
  pcVar24[1] = '\"';
  pcVar24[2] = '\n';
  pcVar22 = pcVar24 + 3;
LAB_00106e81:
  if ((local_50 != (int *)0x0) && (*local_50 == 0)) {
    *local_50 = local_3f30;
  }
  memcpy(pcVar22,pcVar29,(long)iVar4);
  pcVar22[iVar4] = '\0';
LAB_00106eb2:
  local_3f18 = 1;
  psVar15 = local_3f10;
  goto switchD_00106095_default;
}

Assistant:

void Parse(struct lemon *gp)
{
  struct pstate ps;
  FILE *fp;
  char *filebuf;
  int filesize;
  int lineno;
  int c;
  char *cp, *nextcp;
  int startline = 0;

  memset(&ps, '\0', sizeof(ps));
  ps.gp = gp;
  ps.filename = gp->filename;
  ps.errorcnt = 0;
  ps.state = INITIALIZE;

  /* Begin by reading the input file */
  fp = fopen(ps.filename,"rb");
  if( fp==0 ){
    ErrorMsg(ps.filename,0,"Can't open this file for reading.");
    gp->errorcnt++;
    return;
  }
  fseek(fp,0,2);
  filesize = ftell(fp);
  rewind(fp);
  filebuf = (char *)malloc( filesize+1 );
  if( filebuf==0 ){
    ErrorMsg(ps.filename,0,"Can't allocate %d of memory to hold this file.",
      filesize+1);
    gp->errorcnt++;
    return;
  }
  if( fread(filebuf,1,filesize,fp)!=filesize ){
    ErrorMsg(ps.filename,0,"Can't read in all %d bytes of this file.",
      filesize);
    free(filebuf);
    gp->errorcnt++;
    return;
  }
  fclose(fp);
  filebuf[filesize] = 0;

  /* Make an initial pass through the file to handle %ifdef and %ifndef */
  preprocess_input(filebuf);

  /* Now scan the text of the input file */
  lineno = 1;
  for(cp=filebuf; (c= *cp)!=0; ){
    if( c=='\n' ) lineno++;              /* Keep track of the line number */
    if( isspace(c) ){ cp++; continue; }  /* Skip all white space */
    if( c=='/' && cp[1]=='/' ){          /* Skip C++ style comments */
      cp+=2;
      while( (c= *cp)!=0 && c!='\n' ) cp++;
      continue;
    }
    if( c=='/' && cp[1]=='*' ){          /* Skip C style comments */
      cp+=2;
      while( (c= *cp)!=0 && (c!='/' || cp[-1]!='*') ){
        if( c=='\n' ) lineno++;
        cp++;
      }
      if( c ) cp++;
      continue;
    }
    ps.tokenstart = cp;                /* Mark the beginning of the token */
    ps.tokenlineno = lineno;           /* Linenumber on which token begins */
    if( c=='\"' ){                     /* String literals */
      cp++;
      while( (c= *cp)!=0 && c!='\"' ){
        if( c=='\n' ) lineno++;
        cp++;
      }
      if( c==0 ){
        ErrorMsg(ps.filename,startline,
"String starting on this line is not terminated before the end of the file.");
        ps.errorcnt++;
        nextcp = cp;
      }else{
        nextcp = cp+1;
      }
    }else if( c=='{' ){               /* A block of C code */
      int level;
      cp++;
      for(level=1; (c= *cp)!=0 && (level>1 || c!='}'); cp++){
        if( c=='\n' ) lineno++;
        else if( c=='{' ) level++;
        else if( c=='}' ) level--;
        else if( c=='/' && cp[1]=='*' ){  /* Skip comments */
          int prevc;
          cp = &cp[2];
          prevc = 0;
          while( (c= *cp)!=0 && (c!='/' || prevc!='*') ){
            if( c=='\n' ) lineno++;
            prevc = c;
            cp++;
	  }
	}else if( c=='/' && cp[1]=='/' ){  /* Skip C++ style comments too */
          cp = &cp[2];
          while( (c= *cp)!=0 && c!='\n' ) cp++;
          if( c ) lineno++;
	}else if( c=='\'' || c=='\"' ){    /* String a character literals */
          int startchar, prevc;
          startchar = c;
          prevc = 0;
          for(cp++; (c= *cp)!=0 && (c!=startchar || prevc=='\\'); cp++){
            if( c=='\n' ) lineno++;
            if( prevc=='\\' ) prevc = 0;
            else              prevc = c;
	  }
	}
      }
      if( c==0 ){
        ErrorMsg(ps.filename,ps.tokenlineno,
"C code starting on this line is not terminated before the end of the file.");
        ps.errorcnt++;
        nextcp = cp;
      }else{
        nextcp = cp+1;
      }
    }else if( isalnum(c) ){          /* Identifiers */
      while( (c= *cp)!=0 && (isalnum(c) || c=='_') ) cp++;
      nextcp = cp;
    }else if( c==':' && cp[1]==':' && cp[2]=='=' ){ /* The operator "::=" */
      cp += 3;
      nextcp = cp;
    }else if( (c=='/' || c=='|') && isalpha(cp[1]) ){
      cp += 2;
      while( (c = *cp)!=0 && (isalnum(c) || c=='_') ) cp++;
      nextcp = cp;
    }else{                          /* All other (one character) operators */
      cp++;
      nextcp = cp;
    }
    c = *cp;
    *cp = 0;                        /* Null terminate the token */
    parseonetoken(&ps);             /* Parse the token */
    *cp = c;                        /* Restore the buffer */
    cp = nextcp;
  }
  free(filebuf);                    /* Release the buffer after parsing */
  gp->rule = ps.firstrule;
  gp->errorcnt = ps.errorcnt;
}